

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_allocator.h
# Opt level: O0

void __thiscall iffl::debug_memory_resource::increment_busy_block_count(debug_memory_resource *this)

{
  size_t prev_busy_blocks_count;
  debug_memory_resource *this_local;
  
  LOCK();
  (this->busy_blocks_count_).super___atomic_base<unsigned_long>._M_i =
       (this->busy_blocks_count_).super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void increment_busy_block_count() noexcept {
        size_t const prev_busy_blocks_count = busy_blocks_count_.fetch_add(1, std::memory_order_relaxed);
        FFL_CODDING_ERROR_IF_NOT(prev_busy_blocks_count >= 0);
    }